

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O0

wchar_t setup_sparse(archive_read_disk *a,archive_entry *entry)

{
  wchar_t wVar1;
  void *pvVar2;
  la_int64_t lVar3;
  int local_3c;
  la_int64_t lStack_38;
  wchar_t i;
  int64_t offset;
  int64_t length;
  tree *t;
  archive_entry *entry_local;
  archive_read_disk *a_local;
  
  length = (int64_t)a->tree;
  t = (tree *)entry;
  entry_local = (archive_entry *)a;
  wVar1 = archive_entry_sparse_reset(entry);
  *(wchar_t *)(length + 0x1d8) = wVar1;
  if (*(int *)(length + 0x1dc) < *(int *)(length + 0x1d8) + 1) {
    free(*(void **)(length + 0x1c8));
    *(int *)(length + 0x1dc) = *(int *)(length + 0x1d8) + 1;
    pvVar2 = malloc((long)*(int *)(length + 0x1dc) << 4);
    *(void **)(length + 0x1c8) = pvVar2;
    if (*(long *)(length + 0x1c8) == 0) {
      *(undefined4 *)(length + 0x1dc) = 0;
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
      *(undefined4 *)((long)&entry_local->archive + 4) = 0x8000;
      return L'\xffffffe2';
    }
  }
  for (local_3c = 0; local_3c < *(int *)(length + 0x1d8); local_3c = local_3c + 1) {
    archive_entry_sparse_next((archive_entry *)t,&stack0xffffffffffffffc8,&offset);
    *(la_int64_t *)(*(long *)(length + 0x1c8) + (long)local_3c * 0x10 + 8) = lStack_38;
    *(int64_t *)(*(long *)(length + 0x1c8) + (long)local_3c * 0x10) = offset;
  }
  if (local_3c == 0) {
    *(undefined8 *)(*(long *)(length + 0x1c8) + 8) = 0;
    lVar3 = archive_entry_size((archive_entry *)t);
    **(la_int64_t **)(length + 0x1c8) = lVar3;
  }
  else {
    lVar3 = archive_entry_size((archive_entry *)t);
    *(la_int64_t *)(*(long *)(length + 0x1c8) + (long)local_3c * 0x10 + 8) = lVar3;
    *(undefined8 *)(*(long *)(length + 0x1c8) + (long)local_3c * 0x10) = 0;
  }
  *(undefined8 *)(length + 0x1d0) = *(undefined8 *)(length + 0x1c8);
  return L'\0';
}

Assistant:

static int
setup_sparse(struct archive_read_disk *a,
    struct archive_entry *entry, int *fd)
{
	int64_t size;
	off_t initial_off;
	off_t off_s, off_e;
	int exit_sts = ARCHIVE_OK;
	int check_fully_sparse = 0;
	const char *path;

	if (archive_entry_filetype(entry) != AE_IFREG
	    || archive_entry_size(entry) <= 0
	    || archive_entry_hardlink(entry) != NULL)
		return (ARCHIVE_OK);

	/* Does filesystem support the reporting of hole ? */
	if (*fd < 0)
		path = archive_read_disk_entry_setup_path(a, entry, fd);
	else
		path = NULL;

	if (*fd >= 0) {
#ifdef _PC_MIN_HOLE_SIZE
		if (fpathconf(*fd, _PC_MIN_HOLE_SIZE) <= 0)
			return (ARCHIVE_OK);
#endif
		initial_off = lseek(*fd, 0, SEEK_CUR);
		if (initial_off != 0)
			lseek(*fd, 0, SEEK_SET);
	} else {
		if (path == NULL)
			return (ARCHIVE_FAILED);
#ifdef _PC_MIN_HOLE_SIZE
		if (pathconf(path, _PC_MIN_HOLE_SIZE) <= 0)
			return (ARCHIVE_OK);
#endif
		*fd = open(path, O_RDONLY | O_NONBLOCK | O_CLOEXEC);
		if (*fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Can't open `%s'", path);
			return (ARCHIVE_FAILED);
		}
		__archive_ensure_cloexec_flag(*fd);
		initial_off = 0;
	}

#ifndef _PC_MIN_HOLE_SIZE
	/* Check if the underlying filesystem supports seek hole */
	off_s = lseek(*fd, 0, SEEK_HOLE);
	if (off_s < 0)
#if defined(HAVE_LINUX_FIEMAP_H)
		return setup_sparse_fiemap(a, entry, fd);
#else
		goto exit_setup_sparse;
#endif
	else if (off_s > 0)
		lseek(*fd, 0, SEEK_SET);
#endif

	off_s = 0;
	size = archive_entry_size(entry);
	while (off_s < size) {
		off_s = lseek(*fd, off_s, SEEK_DATA);
		if (off_s == (off_t)-1) {
			if (errno == ENXIO) {
				/* no more hole */
				if (archive_entry_sparse_count(entry) == 0) {
					/* Potentially a fully-sparse file. */
					check_fully_sparse = 1;
				}
				break;
			}
			archive_set_error(&a->archive, errno,
			    "lseek(SEEK_HOLE) failed");
			exit_sts = ARCHIVE_FAILED;
			goto exit_setup_sparse;
		}
		off_e = lseek(*fd, off_s, SEEK_HOLE);
		if (off_e == (off_t)-1) {
			if (errno == ENXIO) {
				off_e = lseek(*fd, 0, SEEK_END);
				if (off_e != (off_t)-1)
					break;/* no more data */
			}
			archive_set_error(&a->archive, errno,
			    "lseek(SEEK_DATA) failed");
			exit_sts = ARCHIVE_FAILED;
			goto exit_setup_sparse;
		}
		if (off_s == 0 && off_e == size)
			break;/* This is not sparse. */
		archive_entry_sparse_add_entry(entry, off_s,
			off_e - off_s);
		off_s = off_e;
	}

	if (check_fully_sparse) {
		if (lseek(*fd, 0, SEEK_HOLE) == 0 &&
			lseek(*fd, 0, SEEK_END) == size) {
			/* Fully sparse file; insert a zero-length "data" entry */
			archive_entry_sparse_add_entry(entry, 0, 0);
		}
	}
exit_setup_sparse:
	lseek(*fd, initial_off, SEEK_SET);
	return (exit_sts);
}